

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountTestTest.cpp
# Opt level: O0

string * __thiscall
CountTestText::asString_abi_cxx11_(string *__return_storage_ptr__,CountTestText *this)

{
  element_type *this_00;
  size_t __val;
  CountTestText *this_local;
  
  this_00 = std::
            __shared_ptr_access<const_oout::CountTest,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_oout::CountTest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->count);
  __val = oout::CountTest::count(this_00);
  std::__cxx11::to_string(__return_storage_ptr__,__val);
  return __return_storage_ptr__;
}

Assistant:

string asString() const override
	{
		return to_string(count->count());
	}